

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O0

EGLContext __thiscall
deqp::egl::GLES2SharingTest::createContext
          (GLES2SharingTest *this,EGLDisplay display,EGLContext share,EGLConfig config)

{
  deUint32 dVar1;
  deBool dVar2;
  Library *pLVar3;
  EGLint extraout_var;
  TestError *this_00;
  undefined8 local_44;
  EGLint attriblist [3];
  EGLContext context;
  Library *egl;
  EGLConfig config_local;
  EGLContext share_local;
  EGLDisplay display_local;
  GLES2SharingTest *this_local;
  
  pLVar3 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  attriblist[1] = 0;
  attriblist[2] = 0;
  local_44 = 0x200003098;
  attriblist[0] = 0x3038;
  do {
    (**pLVar3->_vptr_Library)(pLVar3,0x30a0);
    dVar1 = (*pLVar3->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,"bindAPI(EGL_OPENGL_ES_API)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                     ,0x8a);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  attriblist[1] = (*pLVar3->_vptr_Library[6])(pLVar3,display,config,share,&local_44);
  attriblist[2] = extraout_var;
  dVar1 = (*pLVar3->_vptr_Library[0x1f])();
  eglu::checkError(dVar1,"Failed to create GLES2 context",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                   ,0x8d);
  while( true ) {
    dVar2 = ::deGetFalse();
    if ((dVar2 != 0) || (attriblist._4_8_ == 0)) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      return (EGLContext)attriblist._4_8_;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"context != EGL_NO_CONTEXT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x8e);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

EGLContext GLES2SharingTest::createContext (EGLDisplay display, EGLContext share, EGLConfig config)
{
	const Library& egl = m_eglTestCtx.getLibrary();
	EGLContext context = EGL_NO_CONTEXT;
	const EGLint attriblist[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));

	context = egl.createContext(display, config, share, attriblist);
	EGLU_CHECK_MSG(egl, "Failed to create GLES2 context");
	TCU_CHECK(context != EGL_NO_CONTEXT);

	return context;
}